

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.h
# Opt level: O1

int __thiscall ConfigFile::value<int>(ConfigFile *this,string *section,string *name,int *def_val)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  int val;
  stringstream s;
  int local_1ac;
  stringstream local_1a8 [128];
  ios_base local_128 [264];
  
  bVar1 = contains(this,section,name);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
             ::at(&this->data,section);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((pmVar2->
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr,name);
    std::__cxx11::stringstream::stringstream(local_1a8,(string *)pmVar3,_S_out|_S_in);
    std::istream::operator>>((istream *)local_1a8,&local_1ac);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  else {
    local_1ac = *def_val;
  }
  return local_1ac;
}

Assistant:

T value(const std::string &section,
                                const std::string &name,
                                const T &def_val) const {
    if (!contains(section, name)) {
      return def_val;
    }
    std::stringstream s(data.at(section)->at(name));
    T val;
    s >> val;
    return val;
  }